

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void FromWabtValues(Store *store,wasm_val_t *values,ValueTypes *types,Values *wabt_values)

{
  u64 *puVar1;
  pointer pTVar2;
  pointer pTVar3;
  long lVar4;
  ulong uVar5;
  wasm_val_t wVar6;
  TypedValue local_48;
  
  pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pTVar2 - (long)pTVar3 >> 2 ==
      (long)(wabt_values->
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(wabt_values->
            super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)._M_impl.
            super__Vector_impl_data._M_start >> 4) {
    if (pTVar2 != pTVar3) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        local_48.type.enum_ = pTVar3[uVar5].enum_;
        puVar1 = (u64 *)((long)(wabt_values->
                               super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar4);
        local_48.value.i64_ = *puVar1;
        local_48.value._8_8_ = puVar1[1];
        wVar6 = FromWabtValue(store,&local_48);
        (&values->kind)[lVar4] = wVar6.kind;
        ((anon_union_8_5_30786955_for_of *)((long)&values->of + lVar4))->i64 = (int64_t)wVar6.of;
        uVar5 = uVar5 + 1;
        pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = lVar4 + 0x10;
      } while (uVar5 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 2))
      ;
    }
    return;
  }
  __assert_fail("types.size() == wabt_values.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                ,0x1e7,
                "void FromWabtValues(Store &, wasm_val_t *, const ValueTypes &, const Values &)");
}

Assistant:

static void FromWabtValues(Store& store,
                           wasm_val_t values[],
                           const ValueTypes& types,
                           const Values& wabt_values) {
  assert(types.size() == wabt_values.size());
  for (size_t i = 0; i < types.size(); ++i) {
    values[i] = FromWabtValue(store, TypedValue{types[i], wabt_values[i]});
  }
}